

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratGeneric::ComputeStress
          (ChElasticityCosseratGeneric *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> local_d0;
  ChVectorN<double,_6> mstress;
  ChVectorN<double,_6> mstrain;
  
  mstress.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)strain_n;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock(&local_d0,&mstrain,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_d0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&mstress);
  mstress.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (double)strain_m;
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock(&local_d0,&mstrain,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_d0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&mstress);
  local_d0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)&this->mE;
  local_d0.super_Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>.m_rows.m_value
       = (long)&mstrain;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            (&mstress,(Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                       *)&local_d0);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock(&local_d0,&mstress,0,3);
  ChVector<double>::operator=
            (stress_n,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&local_d0);
  Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock(&local_d0,&mstress,3,3);
  ChVector<double>::operator=
            (stress_m,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&local_d0);
  return;
}

Assistant:

void ChElasticityCosseratGeneric::ComputeStress(ChVector<>& stress_n,
                                                ChVector<>& stress_m,
                                                const ChVector<>& strain_n,
                                                const ChVector<>& strain_m) {
    ChVectorN<double, 6> mstrain;
    ChVectorN<double, 6> mstress;
    mstrain.segment(0, 3) = strain_n.eigen();
    mstrain.segment(3, 3) = strain_m.eigen();
    mstress = this->mE * mstrain;
    stress_n = mstress.segment(0, 3);
    stress_m = mstress.segment(3, 3);
}